

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::EncodeAsUTF8Char(uint32 code_point,char *output)

{
  int local_20;
  uint32 local_1c;
  int len;
  uint32 tmp;
  char *output_local;
  uint32 code_point_local;
  
  if (code_point < 0x80) {
    local_20 = 1;
    local_1c = code_point;
  }
  else if (code_point < 0x800) {
    local_1c = (code_point & 0x7c0) << 2 | 0xc080 | code_point & 0x3f;
    local_20 = 2;
  }
  else if (code_point < 0x10000) {
    local_1c = (code_point & 0xf000) << 4 | 0xe08080 | (code_point & 0xfc0) << 2 | code_point & 0x3f
    ;
    local_20 = 3;
  }
  else {
    local_1c = (code_point & 0x1c0000) << 6 | 0xf0808080 | (code_point & 0x3f000) << 4 |
               (code_point & 0xfc0) << 2 | code_point & 0x3f;
    local_20 = 4;
  }
  _len = output;
  output_local._4_4_ = code_point;
  ghtonl(local_1c);
  memcpy(_len,(void *)((long)&len - (long)local_20),(long)local_20);
  return local_20;
}

Assistant:

int EncodeAsUTF8Char(uint32 code_point, char* output) {
  uint32 tmp = 0;
  int len = 0;
  if (code_point <= 0x7f) {
    tmp = code_point;
    len = 1;
  } else if (code_point <= 0x07ff) {
    tmp = 0x0000c080 |
        ((code_point & 0x07c0) << 2) |
        (code_point & 0x003f);
    len = 2;
  } else if (code_point <= 0xffff) {
    tmp = 0x00e08080 |
        ((code_point & 0xf000) << 4) |
        ((code_point & 0x0fc0) << 2) |
        (code_point & 0x003f);
    len = 3;
  } else {
    // UTF-16 is only defined for code points up to 0x10FFFF, and UTF-8 is
    // normally only defined up to there as well.
    tmp = 0xf0808080 |
        ((code_point & 0x1c0000) << 6) |
        ((code_point & 0x03f000) << 4) |
        ((code_point & 0x000fc0) << 2) |
        (code_point & 0x003f);
    len = 4;
  }
  tmp = ghtonl(tmp);
  memcpy(output, reinterpret_cast<const char*>(&tmp) + sizeof(tmp) - len, len);
  return len;
}